

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrlist.h
# Opt level: O0

NFRule ** __thiscall icu_63::NFRuleList::release(NFRuleList *this)

{
  NFRule **ppNVar1;
  NFRule **result;
  NFRuleList *this_local;
  
  add(this,(NFRule *)0x0);
  ppNVar1 = this->fStuff;
  this->fStuff = (NFRule **)0x0;
  this->fCount = 0;
  this->fCapacity = 0;
  return ppNVar1;
}

Assistant:

NFRule** release() {
        add(NULL); // ensure null termination
        NFRule** result = fStuff;
        fStuff = NULL;
        fCount = 0;
        fCapacity = 0;
        return result;
    }